

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O0

void __thiscall
Contact::Contact(Contact *this,string *name,
                unique_ptr<Address,_std::default_delete<Address>_> *address)

{
  bool bVar1;
  unique_ptr<Address,_std::default_delete<Address>_> *address_local;
  string *name_local;
  Contact *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)address);
  if (bVar1) {
    std::unique_ptr<Address,_std::default_delete<Address>_>::operator*(address);
    std::make_unique<Address,Address&>((Address *)&this->work_address);
  }
  else {
    std::unique_ptr<Address,std::default_delete<Address>>::
    unique_ptr<std::default_delete<Address>,void>
              ((unique_ptr<Address,std::default_delete<Address>> *)&this->work_address,
               (nullptr_t)0x0);
  }
  return;
}

Assistant:

explicit Contact(std::string name, std::unique_ptr<Address> address)
		:	name{std::move(name)},
			work_address{address ? std::make_unique<Address>(*address) : nullptr}
	{}